

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfCommand::InvokeInitialPass
          (cmIfCommand *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmIfFunctionBlocker *this_00;
  MessageType status;
  undefined1 local_168 [16];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string err;
  string errorString;
  string local_f8;
  cmListFileContext local_d8;
  cmConditionEvaluator conditionEvaluator;
  
  errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
  errorString._M_string_length = 0;
  errorString.field_2._M_local_buf[0] = '\0';
  expandedArguments.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expandedArguments.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expandedArguments.
  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&expandedArguments,(char *)0x0);
  pcVar1 = (this->super_cmCommand).Makefile;
  cmMakefile::GetExecutionContext(&local_d8,pcVar1);
  cmMakefile::GetBacktrace((cmMakefile *)local_168);
  cmConditionEvaluator::cmConditionEvaluator
            (&conditionEvaluator,pcVar1,&local_d8,(cmListFileBacktrace *)local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
  cmListFileContext::~cmListFileContext(&local_d8);
  bVar2 = cmConditionEvaluator::IsTrue(&conditionEvaluator,&expandedArguments,&errorString,&status);
  if (errorString._M_string_length != 0) {
    cmIfCommandError_abi_cxx11_(&local_f8,&expandedArguments);
    std::operator+(&err,"if ",&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::append((string *)&err);
    pcVar1 = (this->super_cmCommand).Makefile;
    if (status == FATAL_ERROR) {
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&err);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else {
      cmMakefile::IssueMessage(pcVar1,status,&err);
    }
    std::__cxx11::string::~string((string *)&err);
    if (status == FATAL_ERROR) goto LAB_00263f08;
  }
  this_00 = (cmIfFunctionBlocker *)operator_new(0x88);
  memset(this_00,0,0x88);
  cmIfFunctionBlocker::cmIfFunctionBlocker(this_00);
  this_00->ScopeDepth = 1;
  this_00->IsBlocking = !bVar2;
  if (bVar2) {
    this_00->HasRun = true;
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            (&this_00->Args,args);
  cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
LAB_00263f08:
  cmConditionEvaluator::~cmConditionEvaluator(&conditionEvaluator);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&expandedArguments);
  std::__cxx11::string::~string((string *)&errorString);
  return true;
}

Assistant:

bool cmIfCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus&)
{
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  this->Makefile->ExpandArguments(args, expandedArguments);

  MessageType status;

  cmConditionEvaluator conditionEvaluator(
    *(this->Makefile), this->Makefile->GetExecutionContext(),
    this->Makefile->GetBacktrace());

  bool isTrue =
    conditionEvaluator.IsTrue(expandedArguments, errorString, status);

  if (!errorString.empty()) {
    std::string err = "if " + cmIfCommandError(expandedArguments);
    err += errorString;
    if (status == MessageType::FATAL_ERROR) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, err);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }
    this->Makefile->IssueMessage(status, err);
  }

  cmIfFunctionBlocker* f = new cmIfFunctionBlocker();
  // if is isn't true block the commands
  f->ScopeDepth = 1;
  f->IsBlocking = !isTrue;
  if (isTrue) {
    f->HasRun = true;
  }
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}